

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::Detail::Approx::setMargin(Approx *this,double margin)

{
  domain_error local_48 [16];
  string local_38 [32];
  ReusableStringStream local_18;
  
  if (0.0 <= margin) {
    this->m_margin = margin;
    return;
  }
  ReusableStringStream::ReusableStringStream(&local_18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_18.m_oss,"Invalid Approx::margin: ",0x18);
  std::ostream::_M_insert<double>(margin);
  local_38[0] = (string)0x2e;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_18.m_oss,(char *)local_38,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_18.m_oss," Approx::Margin has to be non-negative.",0x27);
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error(local_48,local_38);
  throw_exception<std::domain_error>(local_48);
}

Assistant:

void Approx::setMargin(double margin) {
        CATCH_ENFORCE(margin >= 0,
            "Invalid Approx::margin: " << margin << '.'
            << " Approx::Margin has to be non-negative.");
        m_margin = margin;
    }